

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CGL::GLScene::Mesh::render_in_opengl(Mesh *this)

{
  MeshFeature *in_RDI;
  Mesh *unaff_retaddr;
  Mesh *in_stack_00000040;
  Mesh *in_stack_00000050;
  
  glEnable(0xb50);
  draw_faces(in_stack_00000050);
  glDisable(0xb50);
  draw_edges(in_stack_00000040);
  draw_feature_if_needed(unaff_retaddr,in_RDI);
  draw_feature_if_needed(unaff_retaddr,in_RDI);
  glEnable(0xb50);
  return;
}

Assistant:

void Mesh::render_in_opengl() const {

  // TODO: fix drawing with BSDF
  // DiffuseBSDF* diffuse = dynamic_cast<DiffuseBSDF*>(bsdf);
  // if (diffuse) {
  //   glBindTexture(GL_TEXTURE_2D, 0);
  //   glMaterialfv(GL_FRONT, GL_DIFFUSE, diffuse->albedo.unsafe);
  // }

  // Enable lighting for faces
  glEnable(GL_LIGHTING);
  draw_faces();

  // Edges are drawn with flat shading.
  glDisable(GL_LIGHTING);
  draw_edges();

  // ONLY draw a vertex/half-edge if it's selected.
  draw_feature_if_needed(&hoveredFeature);
  draw_feature_if_needed(&selectedFeature);
  glEnable(GL_LIGHTING);
}